

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int __thiscall CCharmapToUniMB::is_complete_char(CCharmapToUniMB *this,char *p,size_t len)

{
  size_t len_local;
  char *p_local;
  CCharmapToUniMB *this_local;
  uint local_4;
  
  if (this->map_[(byte)*p].sub == (wchar_t *)0x0) {
    local_4 = 1;
  }
  else {
    local_4 = (uint)(1 < len);
  }
  return local_4;
}

Assistant:

virtual int is_complete_char(const char *p, size_t len) const
    {
        /* 
         *   Check the first byte to see if this is a leading byte or a
         *   stand-alone single byte.  
         */
        if (map_[(unsigned char)*p].sub == 0)
        {
            /* 
             *   it's a stand-alone byte, so the character length is one;
             *   'len' is required to be at least 1, so we definitely have a
             *   complete character 
             */
            return TRUE;
        }
        else
        {
            /* it's a lead byte, so the character length is two */
            return (len >= 2);
        }
    }